

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramGenerator.cpp
# Opt level: O2

void __thiscall
rsg::ProgramGenerator::generate
          (ProgramGenerator *this,ProgramParameters *programParams,Shader *vertexShader,
          Shader *fragmentShader)

{
  ProgramParameters *pPVar1;
  GeneratorState *pGVar2;
  int iVar3;
  pointer ppSVar4;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> emptyOutputs;
  ShaderGenerator shaderGen;
  Random rnd;
  GeneratorState state;
  _Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> local_138;
  ShaderGenerator local_118;
  deRandom local_a8;
  GeneratorState local_98;
  
  deRandom_init(&local_a8,programParams->seed);
  GeneratorState::GeneratorState(&local_98,programParams,(Random *)&local_a8);
  ShaderGenerator::ShaderGenerator(&local_118,&local_98);
  local_138._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ShaderGenerator::generate
            (&local_118,&programParams->fragmentParameters,fragmentShader,
             (vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *)&local_138);
  std::_Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::~_Vector_base
            (&local_138);
  ShaderGenerator::~ShaderGenerator(&local_118);
  ShaderGenerator::ShaderGenerator(&local_118,&local_98);
  ShaderGenerator::generate
            (&local_118,&programParams->vertexParameters,vertexShader,&fragmentShader->m_inputs);
  ShaderGenerator::~ShaderGenerator(&local_118);
  local_118.m_state = (GeneratorState *)0x0;
  local_118.m_varManager.m_variableScopeStack.
  super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.m_varManager.m_variableScopeStack.
  super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (ppSVar4 = (vertexShader->m_uniforms).
                 super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      ppSVar4 !=
      (vertexShader->m_uniforms).
      super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppSVar4 = ppSVar4 + 1) {
    if ((((*ppSVar4)->m_variable->m_type).m_baseType & ~TYPE_FLOAT) == TYPE_SAMPLER_2D) {
      std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::push_back
                ((vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *)&local_118,
                 ppSVar4);
    }
  }
  for (ppSVar4 = (fragmentShader->m_uniforms).
                 super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      ppSVar4 !=
      (fragmentShader->m_uniforms).
      super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppSVar4 = ppSVar4 + 1) {
    if ((((*ppSVar4)->m_variable->m_type).m_baseType & ~TYPE_FLOAT) == TYPE_SAMPLER_2D) {
      std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::push_back
                ((vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *)&local_118,
                 ppSVar4);
    }
  }
  iVar3 = 0;
  for (pGVar2 = local_118.m_state;
      pGVar2 != (GeneratorState *)
                local_118.m_varManager.m_variableScopeStack.
                super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pGVar2 = (GeneratorState *)&pGVar2->m_random) {
    pPVar1 = pGVar2->m_programParams;
    if ((**(uint **)pPVar1 & 0xfffffffe) == 6) {
      **(int **)&pPVar1->vertexParameters = iVar3;
      **(int **)&(pPVar1->vertexParameters).maxInputVariables = iVar3;
      iVar3 = iVar3 + 1;
    }
  }
  std::_Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::~_Vector_base
            ((_Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *)&local_118);
  GeneratorState::~GeneratorState(&local_98);
  return;
}

Assistant:

void ProgramGenerator::generate (
	const ProgramParameters&	programParams,
	Shader&						vertexShader,
	Shader&						fragmentShader)
{
	// Random number generator
	de::Random rnd(programParams.seed);

	GeneratorState state(programParams, rnd);

	// Fragment shader
	{
		ShaderGenerator			shaderGen(state);
		vector<ShaderInput*>	emptyOutputs; // \note [pyry] gl_FragColor is added in ShaderGenerator
		shaderGen.generate(programParams.fragmentParameters, fragmentShader, emptyOutputs);
	}

	// Vertex shader
	{
		ShaderGenerator shaderGen(state);

		// Initialize outputs from fragment shader inputs
		const vector<ShaderInput*>& fragmentInputs = fragmentShader.getInputs(); // \note gl_Position and dEQP_Position are handled in ShaderGenerator

		shaderGen.generate(programParams.vertexParameters, vertexShader, fragmentInputs);
	}

	// Allocate samplers \todo [pyry] Randomize allocation.
	{
		const vector<ShaderInput*>&		vertexUniforms		= vertexShader.getUniforms();
		const vector<ShaderInput*>&		fragmentUniforms	= fragmentShader.getUniforms();
		vector<ShaderInput*>			unifiedSamplers;
		int								curSamplerNdx	= 0;

		// Build unified sampler list.
		for (vector<ShaderInput*>::const_iterator i = vertexUniforms.begin(); i != vertexUniforms.end(); i++)
		{
			if ((*i)->getVariable()->getType().isSampler())
				unifiedSamplers.push_back(*i);
		}

		for (vector<ShaderInput*>::const_iterator i = fragmentUniforms.begin(); i != fragmentUniforms.end(); i++)
		{
			if ((*i)->getVariable()->getType().isSampler())
				unifiedSamplers.push_back(*i);
		}

		// Assign sampler indices.
		for (vector<ShaderInput*>::const_iterator i = unifiedSamplers.begin(); i != unifiedSamplers.end(); i++)
		{
			ShaderInput* input = *i;
			if (input->getVariable()->getType().isSampler())
			{
				input->getValueRange().getMin() = curSamplerNdx;
				input->getValueRange().getMax() = curSamplerNdx;
				curSamplerNdx += 1;
			}
		}
	}
}